

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void FTransform2_SSE2(uint8_t *src,uint8_t *ref,int16_t *out)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  long in_RDI;
  __m128i v32h;
  __m128i v01h;
  __m128i v32l;
  __m128i v01l;
  __m128i shuf23h;
  __m128i shuf01h;
  __m128i shuf23l;
  __m128i shuf01l;
  __m128i diff3;
  __m128i diff2;
  __m128i diff1;
  __m128i diff0;
  __m128i ref_3;
  __m128i ref_2;
  __m128i ref_1;
  __m128i ref_0;
  __m128i ref3;
  __m128i ref2;
  __m128i ref1;
  __m128i ref0;
  __m128i src_3;
  __m128i src_2;
  __m128i src_1;
  __m128i src_0;
  __m128i src3;
  __m128i src2;
  __m128i src1;
  __m128i src0;
  __m128i zero;
  __m128i *out32;
  __m128i *out01;
  __m128i *in23;
  __m128i *in01;
  int16_t *out_00;
  __m128i *v32;
  undefined1 local_108;
  undefined1 uStack_107;
  undefined1 uStack_106;
  undefined1 uStack_105;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x60);
  local_f8 = (undefined1)uVar1;
  uStack_f7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_f6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_f5 = (undefined1)((ulong)uVar1 >> 0x18);
  local_108 = 0;
  uStack_107 = 0;
  uStack_106 = 0;
  uStack_105 = 0;
  out_00 = (int16_t *)*in_RSI;
  v32 = (__m128i *)0x0;
  in01 = (__m128i *)in_RSI[4];
  out01 = (__m128i *)in_RSI[8];
  in23 = (__m128i *)0x0;
  out32 = (__m128i *)0x0;
  FTransformPass1_SSE2(in01,(__m128i *)0x0,out01,(__m128i *)0x0);
  FTransformPass1_SSE2(in01,in23,out01,out32);
  FTransformPass2_SSE2
            ((__m128i *)
             CONCAT17(uStack_105,
                      CONCAT16(uStack_f5,
                               CONCAT15(uStack_106,
                                        CONCAT14(uStack_f6,
                                                 CONCAT13(uStack_107,
                                                          CONCAT12(uStack_f7,
                                                                   CONCAT11(local_108,local_f8))))))
                     ),v32,out_00);
  FTransformPass2_SSE2
            ((__m128i *)
             CONCAT17(uStack_105,
                      CONCAT16(uStack_f5,
                               CONCAT15(uStack_106,
                                        CONCAT14(uStack_f6,
                                                 CONCAT13(uStack_107,
                                                          CONCAT12(uStack_f7,
                                                                   CONCAT11(local_108,local_f8))))))
                     ),v32,out_00);
  return;
}

Assistant:

static void FTransform2_SSE2(const uint8_t* src, const uint8_t* ref,
                             int16_t* out) {
  const __m128i zero = _mm_setzero_si128();

  // Load src and convert to 16b.
  const __m128i src0 = _mm_loadl_epi64((const __m128i*)&src[0 * BPS]);
  const __m128i src1 = _mm_loadl_epi64((const __m128i*)&src[1 * BPS]);
  const __m128i src2 = _mm_loadl_epi64((const __m128i*)&src[2 * BPS]);
  const __m128i src3 = _mm_loadl_epi64((const __m128i*)&src[3 * BPS]);
  const __m128i src_0 = _mm_unpacklo_epi8(src0, zero);
  const __m128i src_1 = _mm_unpacklo_epi8(src1, zero);
  const __m128i src_2 = _mm_unpacklo_epi8(src2, zero);
  const __m128i src_3 = _mm_unpacklo_epi8(src3, zero);
  // Load ref and convert to 16b.
  const __m128i ref0 = _mm_loadl_epi64((const __m128i*)&ref[0 * BPS]);
  const __m128i ref1 = _mm_loadl_epi64((const __m128i*)&ref[1 * BPS]);
  const __m128i ref2 = _mm_loadl_epi64((const __m128i*)&ref[2 * BPS]);
  const __m128i ref3 = _mm_loadl_epi64((const __m128i*)&ref[3 * BPS]);
  const __m128i ref_0 = _mm_unpacklo_epi8(ref0, zero);
  const __m128i ref_1 = _mm_unpacklo_epi8(ref1, zero);
  const __m128i ref_2 = _mm_unpacklo_epi8(ref2, zero);
  const __m128i ref_3 = _mm_unpacklo_epi8(ref3, zero);
  // Compute difference. -> 00 01 02 03  00' 01' 02' 03'
  const __m128i diff0 = _mm_sub_epi16(src_0, ref_0);
  const __m128i diff1 = _mm_sub_epi16(src_1, ref_1);
  const __m128i diff2 = _mm_sub_epi16(src_2, ref_2);
  const __m128i diff3 = _mm_sub_epi16(src_3, ref_3);

  // Unpack and shuffle
  // 00 01 02 03   0 0 0 0
  // 10 11 12 13   0 0 0 0
  // 20 21 22 23   0 0 0 0
  // 30 31 32 33   0 0 0 0
  const __m128i shuf01l = _mm_unpacklo_epi32(diff0, diff1);
  const __m128i shuf23l = _mm_unpacklo_epi32(diff2, diff3);
  const __m128i shuf01h = _mm_unpackhi_epi32(diff0, diff1);
  const __m128i shuf23h = _mm_unpackhi_epi32(diff2, diff3);
  __m128i v01l, v32l;
  __m128i v01h, v32h;

  // First pass
  FTransformPass1_SSE2(&shuf01l, &shuf23l, &v01l, &v32l);
  FTransformPass1_SSE2(&shuf01h, &shuf23h, &v01h, &v32h);

  // Second pass
  FTransformPass2_SSE2(&v01l, &v32l, out + 0);
  FTransformPass2_SSE2(&v01h, &v32h, out + 16);
}